

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleARGBRowDown2Box_C(uint8_t *src_argb,ptrdiff_t src_stride,uint8_t *dst_argb,int dst_width)

{
  long lVar1;
  
  lVar1 = 0;
  if (dst_width < 1) {
    dst_width = 0;
  }
  for (; dst_width != (int)lVar1; lVar1 = lVar1 + 1) {
    dst_argb[lVar1 * 4] =
         (uint8_t)((uint)src_argb[lVar1 * 8 + src_stride] +
                   (uint)src_argb[lVar1 * 8 + 4] + (uint)src_argb[lVar1 * 8] +
                   (uint)src_argb[lVar1 * 8 + src_stride + 4] + 2 >> 2);
    dst_argb[lVar1 * 4 + 1] =
         (uint8_t)((uint)src_argb[lVar1 * 8 + src_stride + 1] +
                   (uint)src_argb[lVar1 * 8 + 5] + (uint)src_argb[lVar1 * 8 + 1] +
                   (uint)src_argb[lVar1 * 8 + src_stride + 5] + 2 >> 2);
    dst_argb[lVar1 * 4 + 2] =
         (uint8_t)((uint)src_argb[lVar1 * 8 + src_stride + 2] +
                   (uint)src_argb[lVar1 * 8 + 6] + (uint)src_argb[lVar1 * 8 + 2] +
                   (uint)src_argb[lVar1 * 8 + src_stride + 6] + 2 >> 2);
    dst_argb[lVar1 * 4 + 3] =
         (uint8_t)((uint)src_argb[lVar1 * 8 + src_stride + 3] +
                   (uint)src_argb[lVar1 * 8 + 7] + (uint)src_argb[lVar1 * 8 + 3] +
                   (uint)src_argb[lVar1 * 8 + src_stride + 7] + 2 >> 2);
  }
  return;
}

Assistant:

void ScaleARGBRowDown2Box_C(const uint8_t* src_argb,
                            ptrdiff_t src_stride,
                            uint8_t* dst_argb,
                            int dst_width) {
  int x;
  for (x = 0; x < dst_width; ++x) {
    dst_argb[0] = (src_argb[0] + src_argb[4] + src_argb[src_stride] +
                   src_argb[src_stride + 4] + 2) >>
                  2;
    dst_argb[1] = (src_argb[1] + src_argb[5] + src_argb[src_stride + 1] +
                   src_argb[src_stride + 5] + 2) >>
                  2;
    dst_argb[2] = (src_argb[2] + src_argb[6] + src_argb[src_stride + 2] +
                   src_argb[src_stride + 6] + 2) >>
                  2;
    dst_argb[3] = (src_argb[3] + src_argb[7] + src_argb[src_stride + 3] +
                   src_argb[src_stride + 7] + 2) >>
                  2;
    src_argb += 8;
    dst_argb += 4;
  }
}